

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport
          (ConsumerEndpointImpl *this,SaveTraceForBugreportCallback *consumer_callback)

{
  TracingServiceImpl *this_00;
  bool bVar1;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  function<void_()> local_58;
  undefined1 local_38 [8];
  anon_class_32_1_639d580e on_complete_callback;
  SaveTraceForBugreportCallback *consumer_callback_local;
  ConsumerEndpointImpl *this_local;
  
  on_complete_callback.consumer_callback._M_invoker = (_Invoker_type)consumer_callback;
  std::
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_38,consumer_callback);
  this_00 = this->service_;
  ::std::function<void()>::
  function<perfetto::TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport(std::function<void(bool,std::__cxx11::string_const&)>)::__0,void>
            ((function<void()> *)&local_58,(anon_class_32_1_639d580e *)local_38);
  bVar1 = MaybeSaveTraceForBugreport(this_00,&local_58);
  ::std::function<void_()>::~function((function<void_()> *)&local_58);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "No trace with TraceConfig.bugreport_score > 0 eligible for bug reporting was found",
               &local_89);
    std::
    function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(consumer_callback,false,&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::allocator<char>::~allocator(&local_89);
  }
  SaveTraceForBugreport(std::function<void(bool,std::__cxx11::string_const&)>)::$_0::~__0
            ((__0 *)local_38);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport(
    SaveTraceForBugreportCallback consumer_callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto on_complete_callback = [consumer_callback] {
    if (rename(GetBugreportTmpPath().c_str(), GetBugreportPath().c_str())) {
      consumer_callback(false, "rename(" + GetBugreportTmpPath() + ", " +
                                   GetBugreportPath() + ") failed (" +
                                   strerror(errno) + ")");
    } else {
      consumer_callback(true, GetBugreportPath());
    }
  };
  if (!service_->MaybeSaveTraceForBugreport(std::move(on_complete_callback))) {
    consumer_callback(false,
                      "No trace with TraceConfig.bugreport_score > 0 eligible "
                      "for bug reporting was found");
  }
}